

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

bool storage::BTree::check_(BTNode *nd)

{
  bool bVar1;
  int cnt;
  uint uVar2;
  long local_48;
  int local_2c;
  int i;
  BTInnerNode *inner_node;
  BTNode *node;
  BTNode *nd_local;
  
  BTNode::get_right_brother(nd);
  BTNode::get_left_brother(nd);
  cnt = BTNode::key_count(nd);
  bVar1 = cc(nd->keys_,cnt);
  if (!bVar1) {
    __assert_fail("cc(nd->keys_, nd->key_count())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                  ,0x160,"static bool storage::BTree::check_(BTNode *)");
  }
  if (nd->parent_ == (BTNode *)0x0) {
    if (nd->used_links_count_ < 2) {
      return false;
    }
  }
  else {
    bVar1 = BTNode::check(nd);
    if (!bVar1) {
      return false;
    }
  }
  uVar2 = (**nd->_vptr_BTNode)();
  if ((uVar2 & 1) == 0) {
    if (nd == (BTNode *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = __dynamic_cast(nd,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
    }
    for (local_2c = 0; local_2c < *(int *)(local_48 + 0xdc); local_2c = local_2c + 1) {
      bVar1 = check_(*(BTNode **)(local_48 + 0xe0 + (long)local_2c * 8));
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool BTree::check_(BTNode *nd) {
        nd->get_right_brother();
        nd->get_left_brother();
        assert(cc(nd->keys_, nd->key_count()));
        BTNode *node = nd;
        if (!node->parent_) {
            if (node->used_links_count_ < 2)
                return false;
        } else {
            if (!node->check())
                return false;
        }
        if (!node->is_leaf_node()) {
            auto inner_node = dynamic_cast<BTInnerNode *>(node);
            for (int i = 0; i < inner_node->used_links_count_; ++i) {
                if (!check_(inner_node->links_[i]))
                    return false;
            }
        }
        return true;
    }